

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

void __thiscall
helics::ValueFederate::ValueFederate(ValueFederate *this,string_view fedName,string *configString)

{
  undefined8 *in_RDI;
  FederateInfo *in_stack_fffffffffffffdf0;
  ValueFederate *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe78;
  FederateInfo *in_stack_fffffffffffffe88;
  Federate *in_stack_fffffffffffffe90;
  string_view in_stack_fffffffffffffe98;
  
  loadFederateInfo(in_stack_fffffffffffffe78);
  Federate::Federate(in_stack_fffffffffffffe90,in_stack_fffffffffffffe98,in_stack_fffffffffffffe88);
  FederateInfo::~FederateInfo(in_stack_fffffffffffffdf0);
  *in_RDI = 0x9c2b10;
  in_RDI[2] = 0x9c2be0;
  std::unique_ptr<helics::ValueFederateManager,std::default_delete<helics::ValueFederateManager>>::
  unique_ptr<std::default_delete<helics::ValueFederateManager>,void>
            ((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
              *)(in_RDI + 1));
  loadFederateData(in_stack_fffffffffffffe10);
  return;
}

Assistant:

ValueFederate::ValueFederate(std::string_view fedName, const std::string& configString):
    Federate(fedName, loadFederateInfo(configString))
{
    loadFederateData();
}